

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.h
# Opt level: O0

uint64_t leveldb::DecodeFixed64(char *ptr)

{
  uint64_t result;
  char *ptr_local;
  
  return *(uint64_t *)ptr;
}

Assistant:

inline uint64_t DecodeFixed64(const char *ptr) {
        if (port::kLittleEndian) {
            // Load the raw bytes
            uint64_t result;
            memcpy(&result, ptr, sizeof(result));  // gcc optimizes this to a plain load
            return result;
        } else {
            uint64_t lo = DecodeFixed32(ptr);
            uint64_t hi = DecodeFixed32(ptr + 4);
            return (hi << 32) | lo;
        }
    }